

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O2

bool chooseMidiPort(RtMidi *rtmidi)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  undefined8 uVar5;
  char *pcVar6;
  uint local_98;
  allocator<char> local_91;
  allocator<char> local_90 [32];
  string portName;
  string keyHit;
  
  if (rtmidi == (RtMidi *)0x0) {
    uVar5 = __cxa_bad_typeid();
    std::__cxx11::string::~string((string *)&portName);
    std::__cxx11::string::~string((string *)&keyHit);
    _Unwind_Resume(uVar5);
  }
  bVar1 = std::type_info::operator==
                    (*(type_info **)(*(long *)rtmidi + -8),(type_info *)&RtMidiIn::typeinfo);
  pcVar6 = "\nWould you like to open a virtual output port? [y/N] ";
  if (bVar1) {
    pcVar6 = "\nWould you like to open a virtual input port? [y/N] ";
  }
  std::operator<<((ostream *)&std::cout,pcVar6);
  keyHit._M_dataplus._M_p = (pointer)&keyHit.field_2;
  keyHit._M_string_length = 0;
  keyHit.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&keyHit);
  bVar2 = std::operator==(&keyHit,"y");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&portName,"RtMidi",local_90);
    (**(code **)(*(long *)rtmidi + 8))(rtmidi,&portName);
    std::__cxx11::string::~string((string *)&portName);
    bVar2 = true;
  }
  else {
    portName._M_dataplus._M_p = (pointer)&portName.field_2;
    portName._M_string_length = 0;
    portName.field_2._M_local_buf[0] = '\0';
    local_98 = 0;
    uVar3 = (**(code **)(*(long *)rtmidi + 0x10))(rtmidi);
    bVar2 = uVar3 != 0;
    if (uVar3 == 0) {
      pcVar6 = "No output ports available!";
      if (bVar1) {
        pcVar6 = "No input ports available!";
      }
      poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      if (uVar3 == 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"\nOpening ");
        (**(code **)(*(long *)rtmidi + 0x18))(local_90,rtmidi,0);
        poVar4 = std::operator<<(poVar4,(string *)local_90);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)local_90);
      }
      else {
        pcVar6 = "  Output port #";
        if (bVar1) {
          pcVar6 = "  Input port #";
        }
        for (local_98 = 0; local_98 < uVar3; local_98 = local_98 + 1) {
          (**(code **)(*(long *)rtmidi + 0x18))((string *)local_90,rtmidi,local_98);
          std::__cxx11::string::operator=((string *)&portName,(string *)local_90);
          std::__cxx11::string::~string((string *)local_90);
          poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,(string *)&portName);
          std::operator<<(poVar4,'\n');
        }
        do {
          std::operator<<((ostream *)&std::cout,"\nChoose a port number: ");
          std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
        } while (uVar3 <= local_98);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"RtMidi",&local_91);
      (*(code *)**(undefined8 **)rtmidi)(rtmidi,local_98,local_90);
      std::__cxx11::string::~string((string *)local_90);
    }
    std::__cxx11::string::~string((string *)&portName);
  }
  std::__cxx11::string::~string((string *)&keyHit);
  return bVar2;
}

Assistant:

bool chooseMidiPort( RtMidi *rtmidi )
{
  bool isInput = false;
  if ( typeid( *rtmidi ) == typeid( RtMidiIn ) )
    isInput = true;

  if ( isInput )
    std::cout << "\nWould you like to open a virtual input port? [y/N] ";
  else
    std::cout << "\nWould you like to open a virtual output port? [y/N] ";

  std::string keyHit;
  std::getline( std::cin, keyHit );
  if ( keyHit == "y" ) {
    rtmidi->openVirtualPort();
    return true;
  }

  std::string portName;
  unsigned int i = 0, nPorts = rtmidi->getPortCount();
  if ( nPorts == 0 ) {
    if ( isInput )
      std::cout << "No input ports available!" << std::endl;
    else
      std::cout << "No output ports available!" << std::endl;
    return false;
  }

  if ( nPorts == 1 ) {
    std::cout << "\nOpening " << rtmidi->getPortName() << std::endl;
  }
  else {
    for ( i=0; i<nPorts; i++ ) {
      portName = rtmidi->getPortName(i);
      if ( isInput )
        std::cout << "  Input port #" << i << ": " << portName << '\n';
      else
        std::cout << "  Output port #" << i << ": " << portName << '\n';
    }

    do {
      std::cout << "\nChoose a port number: ";
      std::cin >> i;
    } while ( i >= nPorts );
  }

  std::cout << std::endl;
  rtmidi->openPort( i );

  return true;
}